

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitGraph.c
# Opt level: O1

Kit_Graph_t * Kit_TruthToGraph(uint *pTruth,int nVars,Vec_Int_t *vMemory)

{
  uint fCompl;
  Kit_Graph_t *pKVar1;
  
  fCompl = Kit_TruthIsop(pTruth,nVars,vMemory,1);
  if ((fCompl != 0xffffffff) && (vMemory->nSize < 0x10001)) {
    if (fCompl < 2) {
      pKVar1 = Kit_SopFactor(vMemory,fCompl,nVars,vMemory);
      return pKVar1;
    }
    __assert_fail("RetValue == 0 || RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/kitGraph.c"
                  ,0x16e,"Kit_Graph_t *Kit_TruthToGraph(unsigned int *, int, Vec_Int_t *)");
  }
  return (Kit_Graph_t *)0x0;
}

Assistant:

Kit_Graph_t * Kit_TruthToGraph( unsigned * pTruth, int nVars, Vec_Int_t * vMemory )
{
    Kit_Graph_t * pGraph;
    int RetValue;
    // derive SOP
    RetValue = Kit_TruthIsop( pTruth, nVars, vMemory, 1 ); // tried 1 and found not useful in "renode"
    if ( RetValue == -1 )
        return NULL;
    if ( Vec_IntSize(vMemory) > (1<<16) )
        return NULL;
//    printf( "Isop size = %d.\n", Vec_IntSize(vMemory) );
    assert( RetValue == 0 || RetValue == 1 );
    // derive factored form
    pGraph = Kit_SopFactor( vMemory, RetValue, nVars, vMemory );
    return pGraph;
}